

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

int mfdetach(mFILE *mf)

{
  int iVar1;
  
  if (mf == (mFILE *)0x0) {
    iVar1 = -1;
  }
  else {
    mfflush(mf);
    iVar1 = 0;
    if ((FILE *)mf->fp != (FILE *)0x0) {
      fclose((FILE *)mf->fp);
      mf->fp = (FILE *)0x0;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mfdetach(mFILE *mf) {
    if (!mf)
	return -1;

    mfflush(mf);

    if (mf->fp) {
	fclose(mf->fp);
	mf->fp = NULL;
    }

    return 0;
}